

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

void __thiscall adios2::Engine::PerformDataWrite(Engine *this)

{
  undefined8 *in_RDI;
  string *in_stack_00000068;
  Engine *in_stack_00000070;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"in call to Engine::PerformDataWrite",&local_29);
  helper::CheckForNullptr<adios2::core::Engine>(in_stack_00000070,in_stack_00000068);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  (**(code **)(*(long *)*in_RDI + 0x40))();
  return;
}

Assistant:

void Engine::PerformDataWrite()
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::PerformDataWrite");
    m_Engine->PerformDataWrite();
}